

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * kj::_::concat<kj::StringPtr>(String *__return_storage_ptr__,StringPtr *params)

{
  size_t elementCount;
  char *__src;
  size_t sVar1;
  char *__dest;
  
  elementCount = (params->content).size_;
  __dest = (char *)HeapArrayDisposer::allocateImpl
                             (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                              (_func_void_void_ptr *)0x0);
  __dest[elementCount - 1] = '\0';
  (__return_storage_ptr__->content).ptr = __dest;
  (__return_storage_ptr__->content).size_ = elementCount;
  (__return_storage_ptr__->content).disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  __src = (params->content).ptr;
  sVar1 = (params->content).size_;
  if (__src != __src + (sVar1 - 1)) {
    if (elementCount == 0) {
      __dest = (char *)0x0;
    }
    memcpy(__dest,__src,sVar1 - 1);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}